

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O2

void rlogin_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,int error_code)

{
  Rlogin *rlogin;
  SeatPromptResult spr_00;
  char *pcVar1;
  prompts_t *ppVar2;
  SeatPromptResult spr;
  
  backend_socket_log((Seat *)plug[-6].vt,(LogContext *)plug[-5].vt,type,addr,port,error_msg,
                     error_code,(Conf *)plug[-2].vt,*(_Bool *)&plug[-8].vt);
  if (type != PLUGLOG_CONNECT_SUCCESS) {
    return;
  }
  rlogin = (Rlogin *)(plug + -10);
  *(undefined1 *)&plug[-8].vt = 1;
  pcVar1 = get_remote_username((Conf *)plug[-2].vt);
  if (pcVar1 != (char *)0x0) {
    (**(code **)((plug[-6].vt)->log + 0xb0))(plug[-6].vt,0);
    spr_00._4_4_ = spr._4_4_;
    spr_00.kind = 3;
    spr_00.errfn = spr.errfn;
    spr_00.errdata_lit = (char *)0x0;
    spr_00._24_8_ = spr._24_8_;
    rlogin_startup(rlogin,spr_00,pcVar1);
    safefree(pcVar1);
    return;
  }
  ppVar2 = new_prompts();
  plug[-1].vt = (PlugVtable *)ppVar2;
  ppVar2->to_server = true;
  ppVar2->from_server = false;
  pcVar1 = dupstr("Rlogin login name");
  ppVar2 = (prompts_t *)plug[-1].vt;
  ppVar2->name = pcVar1;
  ppVar2->callback = rlogin_try_username_prompt;
  ppVar2->callback_ctx = rlogin;
  pcVar1 = dupstr("rlogin username: ");
  add_prompt(ppVar2,pcVar1,true);
  rlogin_try_username_prompt(rlogin);
  return;
}

Assistant:

static void rlogin_log(Plug *plug, PlugLogType type, SockAddr *addr, int port,
                       const char *error_msg, int error_code)
{
    Rlogin *rlogin = container_of(plug, Rlogin, plug);
    backend_socket_log(rlogin->seat, rlogin->logctx, type, addr, port,
                       error_msg, error_code,
                       rlogin->conf, rlogin->socket_connected);
    if (type == PLUGLOG_CONNECT_SUCCESS) {
        rlogin->socket_connected = true;

        char *ruser = get_remote_username(rlogin->conf);
        if (ruser) {
            /*
             * If we already know the remote username, call
             * rlogin_startup, which will send the initial protocol
             * greeting including local username, remote username,
             * terminal type and terminal speed.
             */
            /* Next terminal output will come from server */
            seat_set_trust_status(rlogin->seat, false);
            rlogin_startup(rlogin, SPR_OK, ruser);
            sfree(ruser);
        } else {
            /*
             * Otherwise, set up a prompts_t asking for the local
             * username. If it completes synchronously, call
             * rlogin_startup as above; otherwise, wait until it does.
             */
            rlogin->prompt = new_prompts();
            rlogin->prompt->to_server = true;
            rlogin->prompt->from_server = false;
            rlogin->prompt->name = dupstr("Rlogin login name");
            rlogin->prompt->callback = rlogin_try_username_prompt;
            rlogin->prompt->callback_ctx = rlogin;
            add_prompt(rlogin->prompt, dupstr("rlogin username: "), true);
            rlogin_try_username_prompt(rlogin);
        }
    }
}